

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O2

void ImportBlock(uint8_t *src,int src_stride,uint8_t *dst,int w,int h,int size)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 0;
  if (0 < h) {
    iVar1 = h;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    memcpy(dst,src,(long)w);
    if (w < size) {
      memset(dst + w,(uint)dst[w + -1],(long)(size - w));
    }
    dst = dst + 0x20;
    src = src + src_stride;
  }
  for (; h < size; h = h + 1) {
    memcpy(dst,dst + -0x20,(ulong)(uint)size);
    dst = dst + 0x20;
  }
  return;
}

Assistant:

static void ImportBlock(const uint8_t* src, int src_stride,
                        uint8_t* dst, int w, int h, int size) {
  int i;
  for (i = 0; i < h; ++i) {
    memcpy(dst, src, w);
    if (w < size) {
      memset(dst + w, dst[w - 1], size - w);
    }
    dst += BPS;
    src += src_stride;
  }
  for (i = h; i < size; ++i) {
    memcpy(dst, dst - BPS, size);
    dst += BPS;
  }
}